

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_list_data.cpp
# Opt level: O2

void duckdb::ArrowFixedSizeListData::Append
               (ArrowAppendData *append_data,Vector *input,idx_t from,idx_t to,idx_t input_size)

{
  idx_t iVar1;
  Vector *pVVar2;
  reference this;
  type pAVar3;
  UnifiedVectorFormat format;
  UnifiedVectorFormat UStack_78;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&UStack_78);
  Vector::ToUnifiedFormat(input,input_size,&UStack_78);
  AppendValidity(append_data,&UStack_78,from,to);
  Vector::Flatten(input,input_size);
  iVar1 = ArrayType::GetSize(&input->type);
  pVVar2 = ArrayVector::GetEntry(input);
  this = vector<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_true>
         ::get<true>(&append_data->child_data,0);
  pAVar3 = unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>::
           operator*(this);
  (*pAVar3->append_vector)(pAVar3,pVVar2,from * iVar1,iVar1 * to,iVar1 * (to - from));
  append_data->row_count = append_data->row_count + (to - from);
  UnifiedVectorFormat::~UnifiedVectorFormat(&UStack_78);
  return;
}

Assistant:

void ArrowFixedSizeListData::Append(ArrowAppendData &append_data, Vector &input, idx_t from, idx_t to,
                                    idx_t input_size) {
	UnifiedVectorFormat format;
	input.ToUnifiedFormat(input_size, format);
	idx_t size = to - from;
	AppendValidity(append_data, format, from, to);
	input.Flatten(input_size);
	auto array_size = ArrayType::GetSize(input.GetType());
	auto &child_vector = ArrayVector::GetEntry(input);
	auto &child_data = *append_data.child_data[0];
	child_data.append_vector(child_data, child_vector, from * array_size, to * array_size, size * array_size);
	append_data.row_count += size;
}